

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

void saucyGateWay(Abc_Ntk_t *pNtkOrig,Abc_Obj_t *pNodePo,FILE *gFile,int fBooleanMatching,
                 int fLookForSwaps,int fFixOutputs,int fFixInputs,int fQuiet,int fPrintTree)

{
  uint uVar1;
  Vec_Int_t **ppVVar2;
  Vec_Int_t **ppVVar3;
  Abc_Ntk_t *pAVar4;
  int iVar5;
  byte bVar6;
  int iVar7;
  clock_t cVar8;
  char *pcVar9;
  Abc_Ntk_t *pNtk;
  saucy *s;
  Vec_Ptr_t *pVVar10;
  ulong uVar11;
  Vec_Ptr_t **ppVVar12;
  Abc_Obj_t *pAVar13;
  int *colors;
  FILE *pFVar14;
  clock_t cVar15;
  ulong uVar16;
  code *pcVar17;
  uint uVar18;
  byte *pbVar19;
  uint uVar20;
  long lVar21;
  int nCapMin;
  long lVar22;
  int iVar23;
  int local_60;
  saucy_stats stats;
  
  cVar8 = clock();
  if (pNodePo == (Abc_Obj_t *)0x0) {
    pNtk = Abc_NtkDup(pNtkOrig);
  }
  else {
    pAVar13 = (Abc_Obj_t *)pNodePo->pNtk->vObjs->pArray[*(pNodePo->vFanins).pArray];
    pcVar9 = Abc_ObjName(pNodePo);
    pNtk = Abc_NtkCreateCone(pNtkOrig,pAVar13,pcVar9,0);
  }
  if (pNtk->vPis->nSize == 0) {
    Abc_Print(0,"This output is not dependent on any input\n");
    Abc_NtkDelete(pNtk);
    return;
  }
  s = saucy_alloc(pNtk);
  printf("Build functional dependency graph (dependency stats are below) ... ");
  ppVVar2 = s->iDep;
  ppVVar3 = s->oDep;
  pVVar10 = Sim_ComputeFunSupp(pNtk,0);
  for (lVar21 = 0; uVar11 = (ulong)pNtk->vPos->nSize, lVar21 < (long)uVar11; lVar21 = lVar21 + 1) {
    pbVar19 = (byte *)pVVar10->pArray[lVar21];
    for (iVar23 = 7; iVar23 + -7 < pNtk->vPis->nSize; iVar23 = iVar23 + 8) {
      bVar6 = *pbVar19;
      if ((bVar6 & 1) != 0) {
        Vec_IntPushOrder(ppVVar3[lVar21],iVar23 + -7);
        bVar6 = *pbVar19;
      }
      if ((bVar6 & 2) != 0) {
        Vec_IntPushOrder(ppVVar3[lVar21],iVar23 + -6);
        bVar6 = *pbVar19;
      }
      if ((bVar6 & 4) != 0) {
        Vec_IntPushOrder(ppVVar3[lVar21],iVar23 + -5);
        bVar6 = *pbVar19;
      }
      if ((bVar6 & 8) != 0) {
        Vec_IntPushOrder(ppVVar3[lVar21],iVar23 + -4);
        bVar6 = *pbVar19;
      }
      if ((bVar6 & 0x10) != 0) {
        Vec_IntPushOrder(ppVVar3[lVar21],iVar23 + -3);
        bVar6 = *pbVar19;
      }
      if ((bVar6 & 0x20) != 0) {
        Vec_IntPushOrder(ppVVar3[lVar21],iVar23 + -2);
        bVar6 = *pbVar19;
      }
      if ((bVar6 & 0x40) != 0) {
        Vec_IntPushOrder(ppVVar3[lVar21],iVar23 + -1);
        bVar6 = *pbVar19;
      }
      if ((char)bVar6 < '\0') {
        Vec_IntPushOrder(ppVVar3[lVar21],iVar23);
      }
      pbVar19 = pbVar19 + 1;
    }
  }
  for (lVar21 = 0; lVar21 < (int)uVar11; lVar21 = lVar21 + 1) {
    for (iVar23 = 0; iVar23 < ppVVar3[lVar21]->nSize; iVar23 = iVar23 + 1) {
      iVar7 = Vec_IntEntry(ppVVar3[lVar21],iVar23);
      Vec_IntPush(ppVVar2[iVar7],(int)lVar21);
    }
    uVar11 = (ulong)(uint)pNtk->vPos->nSize;
  }
  puts("\t--------------------");
  uVar11 = (ulong)pNtk->vPis->nSize;
  ppVVar12 = (Vec_Ptr_t **)malloc(uVar11 << 3);
  for (lVar21 = 0; lVar21 < (int)uVar11; lVar21 = lVar21 + 1) {
    pVVar10 = Vec_PtrAlloc(0x32);
    ppVVar12[lVar21] = pVVar10;
    uVar11 = (ulong)(uint)pNtk->vPis->nSize;
  }
  lVar21 = 0;
  while( true ) {
    if (pNtk->vCis->nSize <= lVar21) {
      s->topOrder = ppVVar12;
      uVar20 = pNtk->vPos->nSize;
      uVar1 = pNtk->vPis->nSize;
      colors = ints(uVar1 + uVar20);
      uVar11 = 0;
      if (0 < (int)uVar20) {
        uVar11 = (ulong)uVar20;
      }
      if (fFixOutputs == 0) {
        uVar18 = 1;
        for (uVar16 = 0; uVar11 != uVar16; uVar16 = uVar16 + 1) {
          colors[uVar16] = 0;
        }
      }
      else {
        for (uVar16 = 0; uVar18 = uVar20, uVar11 != uVar16; uVar16 = uVar16 + 1) {
          colors[uVar16] = (int)uVar16;
        }
      }
      uVar11 = 0;
      if (0 < (int)uVar1) {
        uVar11 = (ulong)uVar1;
      }
      if (fFixInputs == 0) {
        for (uVar16 = 0; uVar11 != uVar16; uVar16 = uVar16 + 1) {
          colors[(long)(int)uVar20 + uVar16] = uVar18;
        }
      }
      else {
        for (uVar16 = 0; uVar11 != uVar16; uVar16 = uVar16 + 1) {
          colors[(long)(int)uVar20 + uVar16] = uVar18 + (int)uVar16;
        }
      }
      s->fBooleanMatching = fBooleanMatching;
      NUM_SIM1_ITERATION = 0x32;
      if (fBooleanMatching == 0) {
        NUM_SIM1_ITERATION = 200;
      }
      pcVar17 = print_automorphism_quiet;
      if (fQuiet == 0) {
        pcVar17 = print_automorphism_ntk;
      }
      NUM_SIM2_ITERATION = NUM_SIM1_ITERATION;
      s->print_automorphism = pcVar17;
      if (gFile == (FILE *)0x0) {
        gFile = (FILE *)_stdout;
      }
      s->gFile = gFile;
      s->fPrintTree = fPrintTree;
      s->fLookForSwaps = fLookForSwaps;
      saucy_search(pNtk,s,0,colors,&stats);
      pFVar14 = _stdout;
      fprintf(_stdout,"group size = %fe%d\n",stats.grpsize_base,(ulong)(uint)stats.grpsize_exp);
      fprintf(pFVar14,"levels = %d\n",(ulong)(uint)stats.levels);
      fprintf(pFVar14,"nodes = %d\n",(ulong)(uint)stats.nodes);
      fprintf(pFVar14,"generators = %d\n",(ulong)(uint)stats.gens);
      fprintf(pFVar14,"total support = %d\n",(ulong)(uint)stats.support);
      fprintf(pFVar14,"average support = %.2f\n",(double)stats.support / (double)stats.gens);
      fprintf(pFVar14,"nodes per generator = %.2f\n",(double)stats.nodes / (double)stats.gens);
      fprintf(pFVar14,"bad nodes = %d\n",stats.bads);
      if (fBooleanMatching != 0) {
        pcVar9 = "*** Networks are NOT equivalent ***";
        if (0 < stats.grpsize_exp) {
          pcVar9 = "*** Networks are equivalent ***";
        }
        if (1.0 < stats.grpsize_base) {
          pcVar9 = "*** Networks are equivalent ***";
        }
        puts(pcVar9);
      }
      saucy_free(s);
      Abc_NtkDelete(pNtk);
      pFVar14 = fopen("hadi.txt","a");
      fprintf(pFVar14,"group size = %fe%d\n",stats.grpsize_base,(ulong)(uint)stats.grpsize_exp);
      fclose(pFVar14);
      Abc_Print(1,"%s =","Runtime");
      cVar15 = clock();
      local_60 = (int)cVar8;
      Abc_Print(1,"%9.2f sec\n",(double)(cVar15 - local_60) / 1000000.0);
      return;
    }
    pAVar13 = Abc_NtkCi(pNtk,(int)lVar21);
    if ((pNtk->vTravIds).pArray == (int *)0x0) {
      uVar20 = pNtk->vObjs->nSize + 500;
      Vec_IntGrow(&pNtk->vTravIds,uVar20);
      uVar11 = 0;
      if (0 < (int)uVar20) {
        uVar11 = (ulong)uVar20;
      }
      for (uVar16 = 0; uVar11 != uVar16; uVar16 = uVar16 + 1) {
        (pNtk->vTravIds).pArray[uVar16] = 0;
      }
      (pNtk->vTravIds).nSize = uVar20;
    }
    iVar23 = pNtk->nTravIds;
    pNtk->nTravIds = iVar23 + 1;
    if (0x3ffffffe < iVar23) break;
    pAVar4 = pAVar13->pNtk;
    iVar23 = pAVar4->nTravIds;
    uVar20 = (pAVar4->vTravIds).nSize;
    uVar1 = pAVar13->Id;
    if ((int)uVar1 < (int)uVar20) {
      uVar11 = (ulong)uVar20;
    }
    else {
      uVar11 = (long)(int)uVar1 + 1;
      iVar7 = (pAVar4->vTravIds).nCap;
      iVar5 = iVar7 * 2;
      nCapMin = (int)uVar11;
      if ((iVar5 <= (int)uVar1) || (nCapMin = iVar5, iVar7 <= (int)uVar1)) {
        Vec_IntGrow(&pAVar4->vTravIds,nCapMin);
        uVar20 = (pAVar4->vTravIds).nSize;
      }
      for (lVar22 = (long)(int)uVar20; lVar22 < (long)uVar11; lVar22 = lVar22 + 1) {
        (pAVar4->vTravIds).pArray[lVar22] = 0;
      }
      (pAVar4->vTravIds).nSize = (int)uVar11;
    }
    if (((int)uVar1 < 0) || ((int)uVar11 <= (int)uVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar4->vTravIds).pArray[uVar1] = iVar23;
    if (pAVar13->pNtk->ntkType == ABC_NTK_NETLIST) {
      pAVar13 = (Abc_Obj_t *)pAVar13->pNtk->vObjs->pArray[*(pAVar13->vFanouts).pArray];
    }
    for (lVar22 = 0; lVar22 < (pAVar13->vFanouts).nSize; lVar22 = lVar22 + 1) {
      Abc_NtkDfsReverse_rec
                ((Abc_Obj_t *)pAVar13->pNtk->vObjs->pArray[(pAVar13->vFanouts).pArray[lVar22]],
                 ppVVar12[lVar21]);
    }
    lVar21 = lVar21 + 1;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

void saucyGateWay( Abc_Ntk_t * pNtkOrig, Abc_Obj_t * pNodePo, FILE * gFile, int fBooleanMatching, 
                   int fLookForSwaps, int fFixOutputs, int fFixInputs, int fQuiet, int fPrintTree )
{
    Abc_Ntk_t * pNtk;
    struct saucy *s;
    struct saucy_stats stats;
    int *colors;
    int i, clk = clock();   
    
    if (pNodePo == NULL)
        pNtk = Abc_NtkDup( pNtkOrig );
    else
        pNtk = Abc_NtkCreateCone( pNtkOrig, Abc_ObjFanin0(pNodePo), Abc_ObjName(pNodePo), 0 );
    
    if (Abc_NtkPiNum(pNtk) == 0) {
        Abc_Print( 0, "This output is not dependent on any input\n" );
        Abc_NtkDelete( pNtk );
        return;
    }

    s = saucy_alloc( pNtk );    

    /******* Getting Dependencies *******/  
    printf("Build functional dependency graph (dependency stats are below) ... ");      
    getDependencies( pNtk, s->iDep, s->oDep );
    printf("\t--------------------\n");
    /************************************/

    /* Finding toplogical orde */
    s->topOrder = findTopologicalOrder( pNtk );                 

    /* Setting graph colors: outputs = 0 and inputs = 1 */
    colors = ints(Abc_NtkPoNum(pNtk) + Abc_NtkPiNum(pNtk));
    if (fFixOutputs) {
        for (i = 0; i < Abc_NtkPoNum(pNtk); i++)
            colors[i] = i;
    } else {
        for (i = 0; i < Abc_NtkPoNum(pNtk); i++)
            colors[i] = 0;
    }
    if (fFixInputs) {
        int c = (fFixOutputs) ? Abc_NtkPoNum(pNtk) : 1;
        for (i = 0; i < Abc_NtkPiNum(pNtk); i++)
            colors[i+Abc_NtkPoNum(pNtk)] = c+i;     
    } else {
        int c = (fFixOutputs) ? Abc_NtkPoNum(pNtk) : 1;
        for (i = 0; i < Abc_NtkPiNum(pNtk); i++)
            colors[i+Abc_NtkPoNum(pNtk)] = c;   
    }   

    /* Are we looking for Boolean matching? */
    s->fBooleanMatching = fBooleanMatching;
    if (fBooleanMatching) {
        NUM_SIM1_ITERATION = 50;
        NUM_SIM2_ITERATION = 50;
    } else {
        NUM_SIM1_ITERATION = 200;
        NUM_SIM2_ITERATION = 200;
    }

    /* Set the print automorphism routine */
    if (!fQuiet)
        s->print_automorphism = print_automorphism_ntk;
    else
        s->print_automorphism = print_automorphism_quiet;

    /* Set the output file for generators */
    if (gFile == NULL)
        s->gFile = stdout;
    else
        s->gFile = gFile;

    /* Set print tree option */
    s->fPrintTree = fPrintTree;

    /* Set input permutations option */
    s->fLookForSwaps = fLookForSwaps;

    saucy_search(pNtk, s, 0, colors, &stats);   
    print_stats(stdout, stats);
    if (fBooleanMatching) {
        if (stats.grpsize_base > 1 || stats.grpsize_exp > 0)
            printf("*** Networks are equivalent ***\n");
        else
            printf("*** Networks are NOT equivalent ***\n");
    }
    saucy_free(s);
    Abc_NtkDelete(pNtk);

    if (1) {
        FILE * hadi = fopen("hadi.txt", "a");
        fprintf(hadi, "group size = %fe%d\n",
        stats.grpsize_base, stats.grpsize_exp); 
        fclose(hadi);
    }

    ABC_PRT( "Runtime", clock() - clk );

}